

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_19::FieldValuePrinterWrapper::PrintBool
          (FieldValuePrinterWrapper *this,bool val,BaseTextGenerator *generator)

{
  pointer pFVar1;
  byte in_SIL;
  string *in_stack_ffffffffffffffb8;
  BaseTextGenerator *in_stack_ffffffffffffffc0;
  string local_38 [47];
  byte local_9;
  
  local_9 = in_SIL & 1;
  pFVar1 = std::
           unique_ptr<const_google::protobuf::TextFormat::FieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FieldValuePrinter>_>
           ::operator->((unique_ptr<const_google::protobuf::TextFormat::FieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FieldValuePrinter>_>
                         *)0x70d7ce);
  (*pFVar1->_vptr_FieldValuePrinter[2])(local_38,pFVar1,(ulong)(local_9 & 1));
  TextFormat::BaseTextGenerator::PrintString(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void PrintBool(bool val,
                 TextFormat::BaseTextGenerator* generator) const override {
    generator->PrintString(delegate_->PrintBool(val));
  }